

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

stbi_uc * hdr_load_rgbe(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *__s1;
  long lVar8;
  int local_480;
  int z;
  int c2;
  int c1;
  int k;
  int j;
  int i;
  uchar value;
  uchar count;
  int len;
  stbi_uc *rgbe_data;
  stbi_uc *scanline;
  int height;
  int width;
  int valid;
  char *token;
  char buffer [1024];
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi *s_local;
  
  bVar1 = false;
  buffer._1020_4_ = req_comp;
  __s1 = hdr_gettoken(s,(char *)&token);
  iVar2 = strcmp(__s1,"#?RADIANCE");
  if (iVar2 == 0) {
    while (_width = hdr_gettoken(s,(char *)&token), *_width != '\0') {
      iVar2 = strcmp(_width,"FORMAT=32-bit_rle_rgbe");
      if (iVar2 == 0) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      _width = hdr_gettoken(s,(char *)&token);
      iVar2 = strncmp(_width,"-Y ",3);
      if (iVar2 == 0) {
        _width = _width + 3;
        lVar8 = strtol(_width,(char **)&width,10);
        iVar2 = (int)lVar8;
        for (; *_width == ' '; _width = _width + 1) {
        }
        iVar3 = strncmp(_width,"+X ",3);
        if (iVar3 == 0) {
          _width = _width + 3;
          lVar8 = strtol(_width,(char **)0x0,10);
          uVar4 = (uint)lVar8;
          *x = uVar4;
          *y = iVar2;
          *comp = 4;
          buffer[0x3fc] = '\x04';
          buffer[0x3fd] = '\0';
          buffer[0x3fe] = '\0';
          buffer[0x3ff] = '\0';
          s_local = (stbi *)malloc((long)(int)(iVar2 * uVar4 * 4));
          rgbe_data = (stbi_uc *)s_local;
          if (((int)uVar4 < 8) || (0x7fff < (int)uVar4)) {
            c1 = 0;
            goto LAB_001910f3;
          }
          for (c1 = 0; c1 < iVar2; c1 = c1 + 1) {
            iVar3 = get8(s);
            iVar5 = get8(s);
            uVar6 = get8(s);
            if (((iVar3 != 2) || (iVar5 != 2)) || ((uVar6 & 0x80) != 0)) {
              *rgbe_data = (stbi_uc)iVar3;
              rgbe_data[1] = (stbi_uc)iVar5;
              rgbe_data[2] = (stbi_uc)uVar6;
              iVar3 = get8(s);
              rgbe_data[3] = (stbi_uc)iVar3;
              rgbe_data = rgbe_data + 4;
              k = 1;
              c1 = 0;
              do {
                getn(s,rgbe_data,4);
                rgbe_data = rgbe_data + 4;
                k = k + 1;
                while ((int)uVar4 <= k) {
                  c1 = c1 + 1;
LAB_001910f3:
                  if (iVar2 <= c1) {
                    return (stbi_uc *)s_local;
                  }
                  k = 0;
                }
              } while( true );
            }
            uVar7 = get8(s);
            if ((uVar7 | uVar6 << 8) != uVar4) {
              free(s_local);
              e("corrupt HDR");
              return (stbi_uc *)0x0;
            }
            for (c2 = 0; c2 < 4; c2 = c2 + 1) {
              k = 0;
              while (k < (int)uVar4) {
                uVar6 = get8(s);
                if ((byte)uVar6 < 0x81) {
                  for (local_480 = 0; local_480 < (int)(uVar6 & 0xff); local_480 = local_480 + 1) {
                    iVar3 = get8(s);
                    rgbe_data[k * 4 + c2] = (stbi_uc)iVar3;
                    k = k + 1;
                  }
                }
                else {
                  iVar3 = get8(s);
                  for (local_480 = 0; local_480 < (int)(uint)(byte)((byte)uVar6 + 0x80);
                      local_480 = local_480 + 1) {
                    rgbe_data[k * 4 + c2] = (stbi_uc)iVar3;
                    k = k + 1;
                  }
                }
              }
            }
            rgbe_data = rgbe_data + (int)(uVar4 << 2);
          }
        }
        else {
          e("Unsupported HDR format");
          s_local = (stbi *)0x0;
        }
      }
      else {
        e("Unsupported HDR format");
        s_local = (stbi *)0x0;
      }
    }
    else {
      e("Unsupported HDR format");
      s_local = (stbi *)0x0;
    }
  }
  else {
    e("Corrupt HDR image");
    s_local = (stbi *)0x0;
  }
  return (stbi_uc *)s_local;
}

Assistant:

static stbi_uc *hdr_load_rgbe(stbi *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[HDR_BUFLEN];
	char *token;
	int valid = 0;
	int width, height;
   stbi_uc *scanline;
	stbi_uc *rgbe_data;
	int len;
	unsigned char count, value;
	int i, j, k, c1,c2, z;


	// Check identifier
	if (strcmp(hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
		return epuc("not HDR", "Corrupt HDR image");

	// Parse header
	while(1) {
		token = hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
		if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

	if (!valid)    return epuc("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return epuc("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return epuc("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = strtol(token, NULL, 10);

	*x = width;
	*y = height;

	// RGBE _MUST_ come out as 4 components
   *comp = 4;
	req_comp = 4;

	// Read data
	rgbe_data = (stbi_uc *) malloc(height * width * req_comp * sizeof(stbi_uc));
	//	point to the beginning
	scanline = rgbe_data;

	// Load image data
   // image data is stored as some number of scan lines
	if( width < 8 || width >= 32768) {
		// Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
           main_decode_loop:
            //getn(rgbe, 4);
            getn(s,scanline, 4);
			scanline += 4;
         }
      }
	} else {
		// Read RLE-encoded data
		for (j = 0; j < height; ++j) {
         c1 = get8(s);
         c2 = get8(s);
         len = get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            scanline[0] = c1;
            scanline[1] = c2;
            scanline[2] = len;
            scanline[3] = get8(s);
            scanline += 4;
            i = 1;
            j = 0;
            goto main_decode_loop; // yes, this is insane; blame the insane format
         }
         len <<= 8;
         len |= get8(s);
         if (len != width) { free(rgbe_data); return epuc("invalid decoded scanline length", "corrupt HDR"); }
			for (k = 0; k < 4; ++k) {
				i = 0;
				while (i < width) {
					count = get8(s);
					if (count > 128) {
						// Run
						value = get8(s);
                  count -= 128;
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = value;
					} else {
						// Dump
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = get8(s);
					}
				}
			}
			//	move the scanline on
			scanline += 4 * width;
		}
	}

   return rgbe_data;
}